

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CppGenerator.cpp
# Opt level: O0

string * __thiscall CppGenerator::getLowerPointer(CppGenerator *this,string *rel_name,size_t depth)

{
  long in_RCX;
  string *in_RDI;
  char *__rhs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff28;
  allocator *paVar1;
  string local_b8 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff60;
  char *in_stack_ffffffffffffff68;
  string local_78 [32];
  string local_58 [55];
  allocator local_21 [33];
  
  if (in_RCX == 0) {
    paVar1 = local_21;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)in_RDI,"0",paVar1);
    std::allocator<char>::~allocator((allocator<char> *)local_21);
  }
  else {
    __rhs = &stack0xffffffffffffff68;
    std::operator+(in_stack_ffffffffffffff68,in_stack_ffffffffffffff60);
    std::operator+(in_stack_ffffffffffffff28,__rhs);
    std::__cxx11::to_string((unsigned_long)in_stack_ffffffffffffff58);
    std::operator+(in_stack_ffffffffffffff58,in_stack_ffffffffffffff50);
    std::operator+(in_stack_ffffffffffffff28,__rhs);
    std::__cxx11::string::~string(local_58);
    std::__cxx11::string::~string(local_b8);
    std::__cxx11::string::~string(local_78);
    std::__cxx11::string::~string((string *)&stack0xffffffffffffff68);
  }
  return in_RDI;
}

Assistant:

std::string CppGenerator::getLowerPointer(const std::string rel_name, size_t depth)
{
    if (depth == 0)
        return "0";
    return "lowerptr_"+rel_name+"["+std::to_string(depth-1)+"]";
}